

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O2

bool __thiscall SubprocessSet::DoWork(SubprocessSet *this,TokenPool *tokens)

{
  pointer ppSVar1;
  uint __i;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  pointer ppSVar6;
  iterator __position;
  int *piVar7;
  fd_set *__arr;
  fd_set set;
  
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    set.fds_bits[lVar5] = 0;
  }
  ppSVar1 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  iVar3 = 0;
  for (ppSVar6 = (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar6 != ppSVar1; ppSVar6 = ppSVar6 + 1
      ) {
    uVar4 = (*ppSVar6)->fd_;
    if (-1 < (int)uVar4) {
      set.fds_bits[uVar4 >> 6] = set.fds_bits[uVar4 >> 6] | 1L << ((byte)uVar4 & 0x3f);
      if (iVar3 <= (int)uVar4) {
        iVar3 = uVar4 + 1;
      }
    }
  }
  if (tokens != (TokenPool *)0x0) {
    iVar2 = (*tokens->_vptr_TokenPool[7])(tokens);
    set.fds_bits[iVar2 / 0x40] = set.fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
    if (iVar3 <= iVar2) {
      iVar3 = iVar2 + 1;
    }
  }
  interrupted_ = 0;
  iVar3 = pselect(iVar3,(fd_set *)&set,(fd_set *)0x0,(fd_set *)0x0,(timespec *)0x0,
                  (__sigset_t *)&this->old_mask_);
  if (iVar3 == -1) {
    piVar7 = __errno_location();
    if (*piVar7 != 4) {
      perror("ninja: pselect");
      return false;
    }
  }
  else {
    HandlePendingInterruption();
    if (interrupted_ != 0) {
      return true;
    }
    __position._M_current =
         (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    while (__position._M_current !=
           (this->running_).super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      uVar4 = (*__position._M_current)->fd_;
      if ((((int)uVar4 < 0) || (((ulong)set.fds_bits[uVar4 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) == 0)
          ) || (Subprocess::OnPipeReady(*__position._M_current), (*__position._M_current)->fd_ != -1
               )) {
        __position._M_current = __position._M_current + 1;
      }
      else {
        std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>::push_back
                  (&(this->finished_).c,__position._M_current);
        __position = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::erase
                               (&this->running_,__position._M_current);
      }
    }
    if (tokens != (TokenPool *)0x0) {
      uVar4 = (*tokens->_vptr_TokenPool[7])(tokens);
      if ((-1 < (int)uVar4) && (((ulong)set.fds_bits[uVar4 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) != 0)
         ) {
        this->token_available_ = true;
      }
    }
  }
  return interrupted_ != 0;
}

Assistant:

bool SubprocessSet::DoWork(TokenPool* tokens) {
  fd_set set;
  int nfds = 0;
  FD_ZERO(&set);

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i) {
    int fd = (*i)->fd_;
    if (fd >= 0) {
      FD_SET(fd, &set);
      if (nfds < fd+1)
        nfds = fd+1;
    }
  }

  if (tokens) {
    int fd = tokens->GetMonitorFd();
    FD_SET(fd, &set);
    if (nfds < fd+1)
      nfds = fd+1;
  }

  interrupted_ = 0;
  int ret = pselect(nfds, &set, 0, 0, 0, &old_mask_);
  if (ret == -1) {
    if (errno != EINTR) {
      perror("ninja: pselect");
      return false;
    }
    return IsInterrupted();
  }

  HandlePendingInterruption();
  if (IsInterrupted())
    return true;

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ) {
    int fd = (*i)->fd_;
    if (fd >= 0 && FD_ISSET(fd, &set)) {
      (*i)->OnPipeReady();
      if ((*i)->Done()) {
        finished_.push(*i);
        i = running_.erase(i);
        continue;
      }
    }
    ++i;
  }

  if (tokens) {
    int fd = tokens->GetMonitorFd();
    if ((fd >= 0) && FD_ISSET(fd, &set))
    token_available_ = true;
  }

  return IsInterrupted();
}